

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

_Bool ra_has_run_container(roaring_array_t *ra)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t uVar5;
  
  uVar1 = ra->size;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar5 = ra->typecodes[uVar4];
    if (uVar5 == '\x04') {
      uVar5 = *(uint8_t *)((long)ra->containers[uVar4] + 8);
    }
    uVar2 = uVar4 + 1;
  } while (uVar5 != '\x03');
  return (long)uVar4 < (long)(int)uVar1;
}

Assistant:

bool ra_has_run_container(const roaring_array_t *ra) {
    for (int32_t k = 0; k < ra->size; ++k) {
        if (get_container_type(ra->containers[k], ra->typecodes[k]) ==
            RUN_CONTAINER_TYPE)
            return true;
    }
    return false;
}